

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

void push_val(VARR_char *repr,mir_long val)

{
  undefined8 local_20;
  mir_long bound;
  mir_long val_local;
  VARR_char *repr_local;
  
  for (local_20 = 10; bound = val, local_20 <= val; local_20 = local_20 * 10) {
  }
  while (local_20 != 1) {
    local_20 = local_20 / 10;
    VARR_charpush(repr,(char)(bound / local_20) + '0');
    bound = bound % local_20;
  }
  return;
}

Assistant:

static void push_val (VARR (char) * repr, mir_long val) {
  mir_long bound;

  for (bound = 10; val >= bound;) bound *= 10;
  while (bound != 1) {
    bound /= 10;
    VARR_PUSH (char, repr, '0' + val / bound);
    val %= bound;
  }
}